

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O2

bool __thiscall CS248::Shader::linkProgram(Shader *this)

{
  bool bVar1;
  initializer_list<CS248::internal::GLIntId<CS248::internal::ShaderTag>_> __l;
  allocator_type local_31;
  undefined8 local_30;
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  shaders;
  
  local_30._0_4_ = this->vertexShaderId_;
  local_30._4_4_ = this->fragmentShaderId_;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_30;
  std::
  vector<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  ::vector(&shaders,__l,&local_31);
  bVar1 = GLResourceManager::attachShadersAndLinkProgram
                    (this->gl_mgr_,(ProgramId)(this->programId_).id,&shaders);
  std::
  _Vector_base<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
  ::~_Vector_base(&shaders.
                   super__Vector_base<CS248::internal::GLIntId<CS248::internal::ShaderTag>,_std::allocator<CS248::internal::GLIntId<CS248::internal::ShaderTag>_>_>
                 );
  return bVar1;
}

Assistant:

bool Shader::linkProgram() {
  std::vector<ShaderId> shaders = {vertexShaderId_, fragmentShaderId_};
  return gl_mgr_->attachShadersAndLinkProgram(programId_, shaders);
}